

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void SystemZ_printInst(MCInst *MI,SStream *O,void *Info)

{
  MCRegisterInfo *in_stack_00000030;
  SStream *in_stack_00000038;
  MCInst *in_stack_00000040;
  
  printInstruction(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  return;
}

Assistant:

void SystemZ_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
}